

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

bool __thiscall Potassco::SmodelsInput::readCompute(SmodelsInput *this,char *comp,bool val)

{
  bool bVar1;
  byte in_DL;
  ProgramReader *in_RDI;
  Lit_t x;
  _func_int **in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  Span<int> local_40;
  Span<unsigned_int> local_30;
  Head_t local_1c;
  uint local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  bVar1 = ProgramReader::match(in_RDI,(char *)in_stack_ffffffffffffffa8,false);
  uVar2 = 0;
  if (bVar1) {
    ProgramReader::stream(in_RDI);
    BufferedStream::get((BufferedStream *)CONCAT17(uVar2,in_stack_ffffffffffffffb8));
  }
  ProgramReader::require(in_RDI,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0),(char *)0x266c48);
  while (local_18 = ProgramReader::matchPos
                              (in_RDI,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                               (char *)0x266c5e), local_18 != 0) {
    if ((local_11 & 1) != 0) {
      local_18 = neg(local_18);
    }
    in_stack_ffffffffffffffa8 = in_RDI[1]._vptr_ProgramReader;
    Head_t::Head_t(&local_1c,Disjunctive);
    local_30 = toSpan<unsigned_int>();
    local_40 = toSpan<int>((int *)&local_18,1);
    (**(code **)(*in_stack_ffffffffffffffa8 + 0x20))
              (in_stack_ffffffffffffffa8,local_1c.val_,&local_30,&local_40);
  }
  return true;
}

Assistant:

bool SmodelsInput::readCompute(const char* comp, bool val) {
	require(match(comp) && stream()->get() == '\n', "compute statement expected");
	for (Lit_t x; (x = (Lit_t)matchPos()) != 0;) {
		if (val) { x = neg(x); }
		out_.rule(Head_t::Disjunctive, toSpan<Atom_t>(), toSpan(&x, 1));
	}
	return true;
}